

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O0

int symbolBareCmp(uint8_t *left,int leftsize,uint8_t *right,int rightsize)

{
  int local_34;
  int local_30;
  int32_t i;
  int32_t minsize;
  int rightsize_local;
  uint8_t *right_local;
  int leftsize_local;
  uint8_t *left_local;
  
  local_30 = leftsize;
  if (rightsize < leftsize) {
    local_30 = rightsize;
  }
  local_34 = 0;
  while( true ) {
    if (local_30 <= local_34) {
      return leftsize - rightsize;
    }
    if (left[local_34] != right[local_34]) break;
    local_34 = local_34 + 1;
  }
  if (left[local_34] < right[local_34]) {
    return -1;
  }
  return 1;
}

Assistant:

int symbolBareCmp(const uint8_t *left, int leftsize, const uint8_t *right, int rightsize)
{
    int32_t minsize = leftsize;
    int32_t i;

    if (rightsize < minsize)
        minsize = rightsize;
    for (i = 0; i < minsize; i++) {
        if (left[i] != right[i]) {
            if (left[i] < right[i]) {
                return -1;
            } else {
                return 1;
            }
        }
    }
    return (int)leftsize - (int)rightsize;
}